

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxe-init.cc
# Opt level: O0

void cnn::OrthonormalRandom(uint dd,float g,Tensor *x)

{
  initializer_list<unsigned_int> x_00;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> *this;
  int in_EDI;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> svd;
  anon_class_8_1_c254ac82 b;
  normal_distribution<float> distribution;
  Tensor t;
  DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffcb8;
  anon_class_8_1_c254ac82 in_stack_fffffffffffffcc0;
  Dim *in_stack_fffffffffffffce0;
  Tensor *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  uint in_stack_fffffffffffffcf4;
  MatrixType *in_stack_fffffffffffffcf8;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffd00;
  int local_98;
  int local_94;
  int *local_90;
  undefined8 local_88;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  void *local_30;
  int local_4;
  
  local_4 = in_EDI;
  Tensor::Tensor((Tensor *)in_stack_fffffffffffffcc0.distribution);
  local_98 = local_4;
  local_94 = local_4;
  local_90 = &local_98;
  local_88 = 2;
  x_00._M_len._0_4_ = in_stack_fffffffffffffcf0;
  x_00._M_array = (iterator)in_stack_fffffffffffffce8;
  x_00._M_len._4_4_ = in_stack_fffffffffffffcf4;
  Dim::Dim(in_stack_fffffffffffffce0,x_00);
  local_38 = local_5c;
  local_48 = local_6c;
  uStack_40 = uStack_64;
  local_58 = local_7c;
  uStack_50 = uStack_74;
  local_30 = operator_new__((ulong)(uint)(local_4 * local_4) << 2);
  std::normal_distribution<float>::normal_distribution
            (in_stack_fffffffffffffcc0.distribution,
             (result_type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
             SUB84(in_stack_fffffffffffffcb8,0));
  std::generate<float*,cnn::OrthonormalRandom(unsigned_int,float,cnn::Tensor&)::__0>
            ((float *)in_stack_fffffffffffffcb8,(float *)0x7747d7,in_stack_fffffffffffffcc0);
  Tensor::operator*(in_stack_fffffffffffffce8);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((Matrix<float,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffcc0.distribution,
             (EigenBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffcb8);
  Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)0x77481e);
  this = (JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> *)
         Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
                   ((SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_> *)
                    in_stack_fffffffffffffcc0.distribution);
  Tensor::operator*(in_stack_fffffffffffffce8);
  Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)this,
             in_stack_fffffffffffffcb8);
  if (local_30 != (void *)0x0) {
    operator_delete__(local_30);
  }
  Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this);
  Tensor::~Tensor((Tensor *)0x774886);
  return;
}

Assistant:

void OrthonormalRandom(unsigned dd, float g, Tensor& x) {
  Tensor t;
  t.d = Dim({dd, dd});
  t.v = new float[dd * dd];
  normal_distribution<float> distribution(0, 0.01);
  auto b = [&] () {return distribution(*rndeng);};
  generate(t.v, t.v + dd*dd, b);
  Eigen::JacobiSVD<Eigen::MatrixXf> svd(*t, Eigen::ComputeFullU);
  *x = svd.matrixU();
  delete[] t.v;
}